

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::InitializeProfileAllocTracker(Recycler *this)

{
  bool bVar1;
  BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  CCLock *this_01;
  
  bVar1 = DoProfileAllocTracker();
  if (bVar1) {
    this_00 = (BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x38);
    JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,(AllocatorType *)&NoCheckHeapAllocator::Instance,0xa3);
    this->trackerDictionary = this_00;
    this_01 = (CCLock *)operator_new(0x40);
    CCLock::CCLock(this_01,true);
    this->trackerCriticalSection = (CriticalSection *)this_01;
  }
  (this->nextAllocData).typeinfo = (type_info *)0x0;
  (this->nextAllocData).plusSize = 0;
  (this->nextAllocData).count = 0;
  return;
}

Assistant:

void
Recycler::InitializeProfileAllocTracker()
{
    if (DoProfileAllocTracker())
    {
        trackerDictionary = NoCheckHeapNew(TypeInfotoTrackerItemMap, &NoCheckHeapAllocator::Instance, 163);
        trackerCriticalSection = new CriticalSection(1000);
#pragma prefast(suppress:6031, "InitializeCriticalSectionAndSpinCount always succeed since Vista. No need to check return value");
    }

    nextAllocData.Clear();
}